

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_move_nodes(lyd_node *parent,lyd_node **first_dst_p,lyd_node *first_src)

{
  long lVar1;
  lyd_node *plVar2;
  lyd_node *plVar3;
  ly_bool lVar4;
  LY_ERR LVar5;
  lys_module *plVar6;
  lyd_node *node;
  bool bVar7;
  lyd_node *next;
  lyd_node *first_dst;
  lyd_node *local_58;
  lyd_node *local_50;
  lyd_node *local_48;
  lyd_node **local_40;
  lyd_node *local_38;
  
  if ((parent == (lyd_node *)0x0 && first_dst_p == (lyd_node **)0x0) ||
     (first_src->prev->next != (lyd_node *)0x0)) {
    __assert_fail("(parent || first_dst_p) && first_src && !first_src->prev->next",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x3c4,
                  "LY_ERR lyd_move_nodes(struct lyd_node *, struct lyd_node **, struct lyd_node *)")
    ;
  }
  if ((first_dst_p == (lyd_node **)0x0) || (local_48 = *first_dst_p, local_48 == (lyd_node *)0x0)) {
    if ((parent == (lyd_node *)0x0) ||
       ((parent->schema != (lysc_node *)0x0 && ((parent->schema->nodetype & 0x711) == 0)))) {
      local_48 = (lyd_node *)0x0;
    }
    else {
      local_48 = *(lyd_node **)(parent + 1);
    }
  }
  local_50 = first_src;
  if (local_48 == (lyd_node *)0x0) {
    bVar7 = true;
    if ((parent != (lyd_node *)0x0) &&
       ((parent->schema == (lysc_node *)0x0 || ((parent->schema->nodetype & 0x711) != 0)))) {
      lVar1._0_4_ = parent[1].hash;
      lVar1._4_4_ = parent[1].flags;
      bVar7 = lVar1 == 0;
    }
    if (((first_src == (lyd_node *)0x0) || (!bVar7)) || (first_src->parent != (lyd_node_inner *)0x0)
       ) {
      __assert_fail("!lyd_child(parent) && first_src && !first_src->prev->next && !first_src->parent"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                    ,0x378,"LY_ERR lyd_move_nodes_at_once(struct lyd_node *, struct lyd_node *)");
    }
    LVar5 = lyd_unlink_check(first_src);
    plVar3 = first_src;
    if (LVar5 == LY_SUCCESS) {
      node = local_50->next;
      local_58 = local_50;
      local_40 = first_dst_p;
      lyd_unlink_ignore_lyds(&local_50,local_50);
      if (parent != (lyd_node *)0x0) {
        lyd_insert_only_child(parent,local_58);
        lyd_insert_hash(local_58);
      }
      while (node != (lyd_node *)0x0) {
        plVar2 = node->next;
        LVar5 = lyd_unlink_check(node);
        first_dst_p = local_40;
        plVar3 = first_src;
        if (LVar5 != LY_SUCCESS) goto LAB_00120df6;
        lyd_unlink_ignore_lyds(&local_50,node);
        lyd_insert_after_node(&local_58,local_58->prev,node);
        lyd_insert_hash(node);
        node = plVar2;
      }
      LVar5 = LY_SUCCESS;
      first_dst_p = local_40;
      plVar3 = first_src;
    }
  }
  else {
    if (((first_src == (lyd_node *)0x0) || (local_48->prev->next != (lyd_node *)0x0)) ||
       (first_src->parent != (lyd_node_inner *)0x0)) {
      __assert_fail("first_dst && *first_dst && !(*first_dst)->prev->next && first_src && !first_src->prev->next && !first_src->parent"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                    ,0x3a0,"LY_ERR lyd_move_nodes_by_schema(struct lyd_node **, struct lyd_node *)")
      ;
    }
    do {
      lVar4 = lyds_is_supported(first_src);
      if ((lVar4 == '\0') ||
         (LVar5 = lyd_find_sibling_schema(local_48,first_src->schema,&local_38), LVar5 != LY_SUCCESS
         )) {
LAB_00120c87:
        LVar5 = lyd_move_nodes_ordby_schema(&local_48,first_src,&local_58);
        plVar3 = local_48;
        if (LVar5 != LY_SUCCESS) goto LAB_00120df6;
      }
      else {
        LVar5 = lyds_merge(&local_48,&local_38,&local_50,first_src,&local_58);
        if (LVar5 != LY_SUCCESS) {
          if (local_50->schema == (lysc_node *)0x0) {
            plVar6 = (lys_module *)&local_50[2].schema;
          }
          else {
            plVar6 = local_50->schema->module;
          }
          ly_log(plVar6->ctx,LY_LLWRN,LY_SUCCESS,"Data in \"%s\" are not sorted.",
                 local_38->schema->name);
          first_src = local_58;
          goto LAB_00120c87;
        }
      }
      first_src = local_58;
    } while (local_58 != (lyd_node *)0x0);
    LVar5 = LY_SUCCESS;
    plVar3 = local_48;
  }
LAB_00120df6:
  local_48 = plVar3;
  if (first_dst_p != (lyd_node **)0x0) {
    *first_dst_p = local_48;
  }
  return LVar5;
}

Assistant:

static LY_ERR
lyd_move_nodes(struct lyd_node *parent, struct lyd_node **first_dst_p, struct lyd_node *first_src)
{
    LY_ERR ret;
    struct lyd_node *first_dst;

    assert((parent || first_dst_p) && first_src && !first_src->prev->next);

    if (!first_dst_p || !*first_dst_p) {
        first_dst = lyd_child(parent);
    } else {
        first_dst = *first_dst_p;
    }

    if (first_dst) {
        ret = lyd_move_nodes_by_schema(&first_dst, first_src);
    } else {
        ret = lyd_move_nodes_at_once(parent, first_src);
        first_dst = first_src;
    }

    if (first_dst_p) {
        *first_dst_p = first_dst;
    }

    return ret;
}